

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

int __thiscall QGraphicsScenePrivate::init(QGraphicsScenePrivate *this,EVP_PKEY_CTX *ctx)

{
  QGraphicsScene *this_00;
  int iVar1;
  QGraphicsSceneBspTreeIndex *this_01;
  char *pcVar2;
  QPodArrayOps<QGraphicsScene*> *this_02;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScene **)&this->field_0x8;
  this_01 = (QGraphicsSceneBspTreeIndex *)operator_new(0x10);
  QGraphicsSceneBspTreeIndex::QGraphicsSceneBspTreeIndex(this_01,(QGraphicsScene *)this_00);
  this->index = (QGraphicsSceneIndex *)this_01;
  iVar1 = QObjectPrivate::signalIndex((char *)this,(QMetaObject **)0x702cd1);
  this->changedSignalIndex = iVar1;
  pcVar2 = (char *)(*(code *)**(undefined8 **)this_00)(this_00);
  iVar1 = QMetaObject::indexOfSlot(pcVar2);
  this->processDirtyItemsIndex = iVar1;
  pcVar2 = (char *)(*(code *)**(undefined8 **)this_00)(this_00);
  iVar1 = QMetaObject::indexOfSlot(pcVar2);
  this->polishItemsIndex = iVar1;
  this_02 = (QPodArrayOps<QGraphicsScene*> *)(*(long *)(QCoreApplication::self + 8) + 0x178);
  local_48.xp = (qreal)this_00;
  QtPrivate::QPodArrayOps<QGraphicsScene*>::emplace<QGraphicsScene*&>
            (this_02,*(qsizetype *)(*(long *)(QCoreApplication::self + 8) + 0x188),
             (QGraphicsScene **)&local_48);
  QList<QGraphicsScene_*>::end((QList<QGraphicsScene_*> *)this_02);
  local_48.w = 0.0;
  local_48.h = 0.0;
  local_48.xp = 0.0;
  local_48.yp = 0.0;
  QGraphicsScene::update(this_00,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::init()
{
    Q_Q(QGraphicsScene);

    index = new QGraphicsSceneBspTreeIndex(q);

    // Keep this index so we can check for connected slots later on.
    changedSignalIndex = signalIndex("changed(QList<QRectF>)");
    processDirtyItemsIndex = q->metaObject()->indexOfSlot("_q_processDirtyItems()");
    polishItemsIndex = q->metaObject()->indexOfSlot("_q_polishItems()");

    qApp->d_func()->scene_list.append(q);
    q->update();
}